

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::Set
          (RepeatedField<unsigned_int> *this,int index,uint *value)

{
  uint uVar1;
  uint *puVar2;
  uint *in_RDX;
  int in_ESI;
  RepeatedField<unsigned_int> *in_stack_ffffffffffffff90;
  
  uVar1 = *in_RDX;
  puVar2 = elements(in_stack_ffffffffffffff90);
  puVar2[in_ESI] = uVar1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Set(int index, const Element& value) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  elements()[index] = value;
}